

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O0

void build_non_directional_intra_predictors
               (uint8_t *ref,int ref_stride,uint8_t *dst,int dst_stride,PREDICTION_MODE mode,
               TX_SIZE tx_size,int n_top_px,int n_left_px)

{
  byte bVar1;
  int in_ECX;
  uint8_t *in_RDX;
  int in_ESI;
  long in_RDI;
  byte in_R8B;
  byte in_R9B;
  int in_stack_00000008;
  int in_stack_00000010;
  uint8_t *left_col;
  uint8_t *above_row;
  uint8_t above_data [160];
  uint8_t left_data [160];
  int val;
  int i;
  int need_above_left;
  int need_above;
  int need_left;
  int txhpx;
  int txwpx;
  uint8_t *left_ref;
  uint8_t *above_ref;
  uint local_1c8;
  uint local_1c4;
  undefined1 local_198 [15];
  byte local_189;
  byte abStack_188 [144];
  undefined1 local_f8 [15];
  byte local_e9;
  byte abStack_e8 [156];
  uint local_4c;
  int local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  int local_38;
  int local_34;
  byte *local_30;
  byte *local_28;
  byte local_1e;
  byte local_1d;
  int local_1c;
  uint8_t *local_18;
  int local_c;
  
  local_28 = (byte *)(in_RDI - in_ESI);
  local_30 = (byte *)(in_RDI + -1);
  local_34 = tx_size_wide[in_R9B];
  local_38 = tx_size_high[in_R9B];
  bVar1 = "\x06\x04\x02\f\x16\x16\x16\"\f\x06\x06\x06\x16"[in_R8B];
  local_3c = bVar1 & 2;
  local_40 = "\x06\x04\x02\f\x16\x16\x16\"\f\x06\x06\x06\x16"[in_R8B] & 4;
  local_44 = "\x06\x04\x02\f\x16\x16\x16\"\f\x06\x06\x06\x16"[in_R8B] & 0x10;
  local_48 = 0;
  local_1c = in_ECX;
  local_18 = in_RDX;
  if (((("\x06\x04\x02\f\x16\x16\x16\"\f\x06\x06\x06\x16"[in_R8B] & 4) == 0) &&
      (in_stack_00000010 == 0)) || (((bVar1 & 2) == 0 && (in_stack_00000008 == 0)))) {
    if ((bVar1 & 2) == 0) {
      if (in_stack_00000010 < 1) {
        local_1c8 = 0x7f;
      }
      else {
        local_1c8 = (uint)*local_30;
      }
      local_4c = local_1c8;
    }
    else {
      if (in_stack_00000008 < 1) {
        local_1c4 = 0x81;
      }
      else {
        local_1c4 = (uint)*local_28;
      }
      local_4c = local_1c4;
    }
    for (local_48 = 0; local_48 < local_38; local_48 = local_48 + 1) {
      memset(local_18,local_4c & 0xff,(long)local_34);
      local_18 = local_18 + local_1c;
    }
  }
  else {
    local_1e = in_R9B;
    local_1d = in_R8B;
    if ((bVar1 & 2) != 0) {
      local_c = in_ESI;
      memset(local_f8,0x81,0xa0);
      if (in_stack_00000010 < 1) {
        if (0 < in_stack_00000008) {
          memset(abStack_e8,(uint)*local_28,(long)local_38);
        }
      }
      else {
        for (local_48 = 0; local_48 < in_stack_00000010; local_48 = local_48 + 1) {
          abStack_e8[local_48] = local_30[local_48 * local_c];
        }
        if (local_48 < local_38) {
          memset(abStack_e8 + local_48,(uint)abStack_e8[local_48 + -1],(long)(local_38 - local_48));
        }
      }
    }
    if (local_40 != 0) {
      memset(local_198,0x7f,0xa0);
      if (in_stack_00000008 < 1) {
        if (0 < in_stack_00000010) {
          memset(abStack_188,(uint)*local_30,(long)local_34);
        }
      }
      else {
        memcpy(abStack_188,local_28,(long)in_stack_00000008);
        local_48 = in_stack_00000008;
        if (in_stack_00000008 < local_34) {
          memset(abStack_188 + in_stack_00000008,(uint)abStack_188[in_stack_00000008 + -1],
                 (long)(local_34 - in_stack_00000008));
        }
      }
    }
    if (local_44 != 0) {
      if ((in_stack_00000008 < 1) || (in_stack_00000010 < 1)) {
        if (in_stack_00000008 < 1) {
          if (in_stack_00000010 < 1) {
            local_189 = 0x80;
          }
          else {
            local_189 = *local_30;
          }
        }
        else {
          local_189 = *local_28;
        }
      }
      else {
        local_189 = local_28[-1];
      }
      local_e9 = local_189;
    }
    if (local_1d == 0) {
      (*dc_pred[(int)(uint)(0 < in_stack_00000010)][(int)(uint)(0 < in_stack_00000008)][local_1e])
                (local_18,(long)local_1c,abStack_188,abStack_e8);
    }
    else {
      (*pred[local_1d][local_1e])(local_18,(long)local_1c,abStack_188,abStack_e8);
    }
  }
  return;
}

Assistant:

static void build_non_directional_intra_predictors(
    const uint8_t *ref, int ref_stride, uint8_t *dst, int dst_stride,
    PREDICTION_MODE mode, TX_SIZE tx_size, int n_top_px, int n_left_px) {
  const uint8_t *above_ref = ref - ref_stride;
  const uint8_t *left_ref = ref - 1;
  const int txwpx = tx_size_wide[tx_size];
  const int txhpx = tx_size_high[tx_size];
  const int need_left = extend_modes[mode] & NEED_LEFT;
  const int need_above = extend_modes[mode] & NEED_ABOVE;
  const int need_above_left = extend_modes[mode] & NEED_ABOVELEFT;
  int i = 0;
  assert(n_top_px >= 0);
  assert(n_left_px >= 0);
  assert(mode == DC_PRED || mode == SMOOTH_PRED || mode == SMOOTH_V_PRED ||
         mode == SMOOTH_H_PRED || mode == PAETH_PRED);

  if ((!need_above && n_left_px == 0) || (!need_left && n_top_px == 0)) {
    int val = 0;
    if (need_left) {
      val = (n_top_px > 0) ? above_ref[0] : 129;
    } else {
      val = (n_left_px > 0) ? left_ref[0] : 127;
    }
    for (i = 0; i < txhpx; ++i) {
      memset(dst, val, txwpx);
      dst += dst_stride;
    }
    return;
  }

  DECLARE_ALIGNED(16, uint8_t, left_data[NUM_INTRA_NEIGHBOUR_PIXELS]);
  DECLARE_ALIGNED(16, uint8_t, above_data[NUM_INTRA_NEIGHBOUR_PIXELS]);
  uint8_t *const above_row = above_data + 16;
  uint8_t *const left_col = left_data + 16;

  if (need_left) {
    memset(left_data, 129, NUM_INTRA_NEIGHBOUR_PIXELS);
    if (n_left_px > 0) {
      for (i = 0; i < n_left_px; i++) left_col[i] = left_ref[i * ref_stride];
      if (i < txhpx) memset(&left_col[i], left_col[i - 1], txhpx - i);
    } else if (n_top_px > 0) {
      memset(left_col, above_ref[0], txhpx);
    }
  }

  if (need_above) {
    memset(above_data, 127, NUM_INTRA_NEIGHBOUR_PIXELS);
    if (n_top_px > 0) {
      memcpy(above_row, above_ref, n_top_px);
      i = n_top_px;
      if (i < txwpx) memset(&above_row[i], above_row[i - 1], txwpx - i);
    } else if (n_left_px > 0) {
      memset(above_row, left_ref[0], txwpx);
    }
  }

  if (need_above_left) {
    if (n_top_px > 0 && n_left_px > 0) {
      above_row[-1] = above_ref[-1];
    } else if (n_top_px > 0) {
      above_row[-1] = above_ref[0];
    } else if (n_left_px > 0) {
      above_row[-1] = left_ref[0];
    } else {
      above_row[-1] = 128;
    }
    left_col[-1] = above_row[-1];
  }

  if (mode == DC_PRED) {
    dc_pred[n_left_px > 0][n_top_px > 0][tx_size](dst, dst_stride, above_row,
                                                  left_col);
  } else {
    pred[mode][tx_size](dst, dst_stride, above_row, left_col);
  }
}